

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

void json_value_free(JSON_Value *value)

{
  JSON_Value_Type JVar1;
  JSON_Value *value_local;
  
  JVar1 = json_value_get_type(value);
  if (JVar1 == 2) {
    (*parson_free)((value->value).string.chars);
  }
  else if (JVar1 == 4) {
    json_object_free((value->value).object);
  }
  else if (JVar1 == 5) {
    json_array_free((value->value).array);
  }
  (*parson_free)(value);
  return;
}

Assistant:

void json_value_free(JSON_Value *value) {
    switch (json_value_get_type(value)) {
        case JSONObject:
            json_object_free(value->value.object);
            break;
        case JSONString:
            parson_free(value->value.string.chars);
            break;
        case JSONArray:
            json_array_free(value->value.array);
            break;
        default:
            break;
    }
    parson_free(value);
}